

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::sr::ShaderRenderCaseInstance::iterate
          (TestStatus *__return_storage_ptr__,ShaderRenderCaseInstance *this)

{
  PtrData<vkt::sr::QuadGrid,_de::DefaultDeleter<vkt::sr::QuadGrid>_> data;
  uint height_00;
  uint width_00;
  deUint32 dVar1;
  deUint32 numTriangles;
  QuadGrid *pQVar2;
  deUint16 *indices;
  Vec4 *constCoords;
  QuadGrid *textures;
  undefined8 in_stack_fffffffffffffe50;
  allocator<char> *__a;
  allocator<char> local_139;
  string local_138;
  undefined4 local_118;
  allocator<char> local_111;
  string local_110;
  undefined1 local_e9;
  undefined1 local_e8 [7];
  bool compareOk;
  Surface refImage;
  PixelBufferAccess local_a8;
  undefined1 local_80 [8];
  Surface resImage;
  Vec4 local_58;
  PtrData<vkt::sr::QuadGrid,_de::DefaultDeleter<vkt::sr::QuadGrid>_> local_48;
  PtrData<vkt::sr::QuadGrid,_de::DefaultDeleter<vkt::sr::QuadGrid>_> *local_38;
  uint local_28;
  uint local_24;
  int height;
  int width;
  UVec2 viewportSize;
  ShaderRenderCaseInstance *this_local;
  
  viewportSize.m_data = (uint  [2])this;
  (*(this->super_TestInstance)._vptr_TestInstance[4])();
  getViewportSize((ShaderRenderCaseInstance *)&height);
  local_24 = tcu::Vector<unsigned_int,_2>::x((Vector<unsigned_int,_2> *)&height);
  local_28 = tcu::Vector<unsigned_int,_2>::y((Vector<unsigned_int,_2> *)&height);
  pQVar2 = (QuadGrid *)operator_new(0x130);
  width_00 = local_24;
  height_00 = local_28;
  dVar1 = this->m_quadGridSize;
  getDefaultConstCoords();
  textures = (QuadGrid *)&this->m_textures;
  QuadGrid::QuadGrid(pQVar2,dVar1,width_00,height_00,&local_58,&this->m_userAttribTransforms,
                     (vector<de::SharedPtr<vkt::sr::TextureBinding>,_std::allocator<de::SharedPtr<vkt::sr::TextureBinding>_>_>
                      *)textures);
  de::DefaultDeleter<vkt::sr::QuadGrid>::DefaultDeleter
            ((DefaultDeleter<vkt::sr::QuadGrid> *)((long)&resImage.m_pixels.m_cap + 3));
  de::details::MovePtr<vkt::sr::QuadGrid,_de::DefaultDeleter<vkt::sr::QuadGrid>_>::MovePtr();
  local_38 = de::details::MovePtr::operator_cast_to_PtrData(&local_48,(MovePtr *)pQVar2);
  data._8_8_ = in_stack_fffffffffffffe50;
  data.ptr = textures;
  de::details::MovePtr<vkt::sr::QuadGrid,_de::DefaultDeleter<vkt::sr::QuadGrid>_>::operator=
            (&this->m_quadGrid,data);
  de::details::MovePtr<vkt::sr::QuadGrid,_de::DefaultDeleter<vkt::sr::QuadGrid>_>::~MovePtr
            ((MovePtr<vkt::sr::QuadGrid,_de::DefaultDeleter<vkt::sr::QuadGrid>_> *)&local_48);
  tcu::Surface::Surface((Surface *)local_80,local_24,local_28);
  pQVar2 = de::details::UniqueBase<vkt::sr::QuadGrid,_de::DefaultDeleter<vkt::sr::QuadGrid>_>::
           operator->(&(this->m_quadGrid).
                       super_UniqueBase<vkt::sr::QuadGrid,_de::DefaultDeleter<vkt::sr::QuadGrid>_>);
  dVar1 = QuadGrid::getNumVertices(pQVar2);
  pQVar2 = de::details::UniqueBase<vkt::sr::QuadGrid,_de::DefaultDeleter<vkt::sr::QuadGrid>_>::
           operator->(&(this->m_quadGrid).
                       super_UniqueBase<vkt::sr::QuadGrid,_de::DefaultDeleter<vkt::sr::QuadGrid>_>);
  numTriangles = QuadGrid::getNumTriangles(pQVar2);
  pQVar2 = de::details::UniqueBase<vkt::sr::QuadGrid,_de::DefaultDeleter<vkt::sr::QuadGrid>_>::
           operator->(&(this->m_quadGrid).
                       super_UniqueBase<vkt::sr::QuadGrid,_de::DefaultDeleter<vkt::sr::QuadGrid>_>);
  indices = QuadGrid::getIndices(pQVar2);
  pQVar2 = de::details::UniqueBase<vkt::sr::QuadGrid,_de::DefaultDeleter<vkt::sr::QuadGrid>_>::
           operator->(&(this->m_quadGrid).
                       super_UniqueBase<vkt::sr::QuadGrid,_de::DefaultDeleter<vkt::sr::QuadGrid>_>);
  constCoords = QuadGrid::getConstCoords(pQVar2);
  render(this,dVar1,numTriangles,indices,constCoords);
  tcu::Surface::getAccess(&local_a8,(Surface *)local_80);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&refImage.m_pixels.m_cap,&this->m_resultImage);
  tcu::copy((EVP_PKEY_CTX *)&local_a8,(EVP_PKEY_CTX *)&refImage.m_pixels.m_cap);
  tcu::Surface::Surface((Surface *)local_e8,local_24,local_28);
  if ((this->m_isVertexCase & 1U) == 0) {
    pQVar2 = de::details::UniqueBase<vkt::sr::QuadGrid,_de::DefaultDeleter<vkt::sr::QuadGrid>_>::
             operator*(&(this->m_quadGrid).
                        super_UniqueBase<vkt::sr::QuadGrid,_de::DefaultDeleter<vkt::sr::QuadGrid>_>)
    ;
    computeFragmentReference(this,(Surface *)local_e8,pQVar2);
  }
  else {
    pQVar2 = de::details::UniqueBase<vkt::sr::QuadGrid,_de::DefaultDeleter<vkt::sr::QuadGrid>_>::
             operator*(&(this->m_quadGrid).
                        super_UniqueBase<vkt::sr::QuadGrid,_de::DefaultDeleter<vkt::sr::QuadGrid>_>)
    ;
    computeVertexReference(this,(Surface *)local_e8,pQVar2);
  }
  local_e9 = compareImages(this,(Surface *)local_80,(Surface *)local_e8,0.2);
  if ((bool)local_e9) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"Result image matches reference",&local_111);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator(&local_111);
  }
  else {
    __a = &local_139;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"Image mismatch",__a);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator(&local_139);
  }
  local_118 = 1;
  tcu::Surface::~Surface((Surface *)local_e8);
  tcu::Surface::~Surface((Surface *)local_80);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus ShaderRenderCaseInstance::iterate (void)
{
	setup();

	// Create quad grid.
	const tcu::UVec2	viewportSize	= getViewportSize();
	const int			width			= viewportSize.x();
	const int			height			= viewportSize.y();

	m_quadGrid							= de::MovePtr<QuadGrid>(new QuadGrid(m_quadGridSize, width, height, getDefaultConstCoords(), m_userAttribTransforms, m_textures));

	// Render result.
	tcu::Surface		resImage		(width, height);

	render(m_quadGrid->getNumVertices(), m_quadGrid->getNumTriangles(), m_quadGrid->getIndices(), m_quadGrid->getConstCoords());
	tcu::copy(resImage.getAccess(), m_resultImage.getAccess());

	// Compute reference.
	tcu::Surface		refImage		(width, height);
	if (m_isVertexCase)
		computeVertexReference(refImage, *m_quadGrid);
	else
		computeFragmentReference(refImage, *m_quadGrid);

	// Compare.
	const bool			compareOk		= compareImages(resImage, refImage, 0.2f);

	if (compareOk)
		return tcu::TestStatus::pass("Result image matches reference");
	else
		return tcu::TestStatus::fail("Image mismatch");
}